

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic1::UnitTest_semantic1(UnitTest_semantic1 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_002692e8;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"semantic1");
  return;
}

Assistant:

TEST_CASE(semantic1)
{
    auto ast = Semantic("a, b = c, d");
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto b = ASTFind<luna::Terminator>(ast, FindName("b"));
    auto c = ASTFind<luna::Terminator>(ast, FindName("c"));
    auto d = ASTFind<luna::Terminator>(ast, FindName("d"));
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(b->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(c->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(d->semantic_ == luna::SemanticOp_Read);
}